

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_negation_range
                (array_container_t *src,int range_start,int range_end,container_t **dst)

{
  ushort uVar1;
  uint64_t *puVar2;
  uint16_t *puVar3;
  int iVar4;
  bitset_container_t *pbVar5;
  array_container_t *paVar6;
  ulong uVar7;
  uint16_t *puVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  
  if (range_end - range_start == 0 || range_end < range_start) {
    paVar6 = array_container_create_given_capacity(src->capacity);
    if (paVar6 != (array_container_t *)0x0) {
      iVar4 = src->cardinality;
      paVar6->cardinality = iVar4;
      memcpy(paVar6->array,src->array,(long)iVar4 * 2);
    }
    *dst = paVar6;
  }
  else {
    iVar4 = src->cardinality;
    if (iVar4 < 1) {
      uVar13 = 0;
      uVar14 = 0xffffffff;
    }
    else {
      iVar12 = iVar4 + -1;
      uVar14 = 0;
      iVar15 = iVar12;
      do {
        uVar13 = iVar15 + uVar14 >> 1;
        uVar10 = *(ushort *)((long)src->array + (ulong)(iVar15 + uVar14 & 0xfffffffe));
        if (uVar10 < (ushort)range_start) {
          uVar14 = uVar13 + 1;
        }
        else {
          if (uVar10 <= (ushort)range_start) goto LAB_0010e753;
          iVar15 = uVar13 - 1;
        }
      } while ((int)uVar14 <= iVar15);
      uVar13 = (int)uVar14 >> 0x1f ^ uVar14;
LAB_0010e753:
      uVar10 = (short)range_end - 1;
      uVar11 = 0;
      do {
        uVar14 = iVar12 + uVar11 >> 1;
        uVar1 = *(ushort *)((long)src->array + (ulong)(iVar12 + uVar11 & 0xfffffffe));
        if (uVar1 < uVar10) {
          uVar11 = uVar14 + 1;
        }
        else {
          if (uVar1 <= uVar10) goto LAB_0010e7cd;
          iVar12 = uVar14 - 1;
        }
      } while ((int)uVar11 <= iVar12);
      uVar14 = uVar11 - 1;
      if ((int)uVar11 < 0) {
        uVar14 = ~uVar11;
      }
    }
LAB_0010e7cd:
    iVar4 = (range_end - range_start) + iVar4 + (uVar13 - uVar14) * 2 + -2;
    if (0x1000 < iVar4) {
      pbVar5 = bitset_container_from_array(src);
      if (range_end != range_start) {
        puVar2 = pbVar5->words;
        uVar9 = (ulong)((uint)range_start >> 6);
        uVar14 = range_end - 1U >> 6;
        puVar2[uVar9] = ~(-1L << ((byte)range_start & 0x3f) ^ puVar2[uVar9]);
        if ((uint)range_start >> 6 < uVar14) {
          do {
            puVar2[uVar9] = ~puVar2[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar14 != uVar9);
        }
        puVar2[uVar14] = puVar2[uVar14] ^ 0xffffffffffffffffU >> (-(char)range_end & 0x3fU);
      }
      pbVar5->cardinality = iVar4;
      *dst = pbVar5;
      return true;
    }
    paVar6 = array_container_create_given_capacity(iVar4);
    *dst = paVar6;
    if (iVar4 != 0) {
      memcpy(paVar6->array,src->array,(ulong)uVar13 * 2);
      if ((int)uVar14 < (int)uVar13) {
        uVar7 = (ulong)uVar13;
      }
      else {
        puVar3 = src->array;
        uVar9 = (ulong)uVar13;
        do {
          if ((uint16_t)range_start == puVar3[uVar13]) {
            uVar13 = uVar13 + 1;
            uVar7 = uVar9;
          }
          else {
            uVar7 = (ulong)((int)uVar9 + 1);
            paVar6->array[uVar9] = (uint16_t)range_start;
          }
          range_start = range_start + 1;
        } while ((range_start < range_end) && (uVar9 = uVar7, (int)uVar13 <= (int)uVar14));
      }
      uVar13 = (uint)uVar7;
      puVar3 = paVar6->array;
      if (range_start < range_end) {
        puVar8 = puVar3 + uVar7;
        uVar13 = (uVar13 + range_end) - range_start;
        do {
          *puVar8 = (uint16_t)range_start;
          range_start = range_start + 1;
          puVar8 = puVar8 + 1;
        } while (range_end != range_start);
      }
      memcpy(puVar3 + uVar13,src->array + ((long)(int)uVar14 + 1U & 0xffffffff),
             ((long)src->cardinality - ((long)(int)uVar14 + 1U)) * 2);
    }
    paVar6->cardinality = iVar4;
  }
  return false;
}

Assistant:

bool array_container_negation_range(
    const array_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    /* close port of the Java implementation */
    if (range_start >= range_end) {
        *dst = array_container_clone(src);
        return false;
    }

    int32_t start_index =
        binarySearch(src->array, src->cardinality, (uint16_t)range_start);
    if (start_index < 0) start_index = -start_index - 1;

    int32_t last_index =
        binarySearch(src->array, src->cardinality, (uint16_t)(range_end - 1));
    if (last_index < 0) last_index = -last_index - 2;

    const int32_t current_values_in_range = last_index - start_index + 1;
    const int32_t span_to_be_flipped = range_end - range_start;
    const int32_t new_values_in_range =
        span_to_be_flipped - current_values_in_range;
    const int32_t cardinality_change =
        new_values_in_range - current_values_in_range;
    const int32_t new_cardinality = src->cardinality + cardinality_change;

    if (new_cardinality > DEFAULT_MAX_SIZE) {
        bitset_container_t *temp = bitset_container_from_array(src);
        bitset_flip_range(temp->words, (uint32_t)range_start,
                          (uint32_t)range_end);
        temp->cardinality = new_cardinality;
        *dst = temp;
        return true;
    }

    array_container_t *arr =
        array_container_create_given_capacity(new_cardinality);
    *dst = (container_t *)arr;
    if(new_cardinality == 0) {
      arr->cardinality = new_cardinality;
      return false; // we are done.
    }
    // copy stuff before the active area
    memcpy(arr->array, src->array, start_index * sizeof(uint16_t));

    // work on the range
    int32_t out_pos = start_index, in_pos = start_index;
    int32_t val_in_range = range_start;
    for (; val_in_range < range_end && in_pos <= last_index; ++val_in_range) {
        if ((uint16_t)val_in_range != src->array[in_pos]) {
            arr->array[out_pos++] = (uint16_t)val_in_range;
        } else {
            ++in_pos;
        }
    }
    for (; val_in_range < range_end; ++val_in_range)
        arr->array[out_pos++] = (uint16_t)val_in_range;

    // content after the active range
    memcpy(arr->array + out_pos, src->array + (last_index + 1),
           (src->cardinality - (last_index + 1)) * sizeof(uint16_t));
    arr->cardinality = new_cardinality;
    return false;
}